

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-xml-cpp.cpp
# Opt level: O2

bool string_equals(xml_string *a,char *b)

{
  byte *pbVar1;
  char *pcVar2;
  size_t length;
  size_t sVar3;
  uint8_t *buffer;
  size_t sVar4;
  ostream *poVar5;
  bool bVar6;
  
  length = xml_string_length(a);
  sVar3 = strlen(b);
  buffer = (uint8_t *)operator_new__(length + 1);
  xml_string_copy(a,buffer,length);
  buffer[length] = '\0';
  if (length == sVar3) {
    sVar4 = 0;
    do {
      if (length == sVar4) {
        bVar6 = true;
        goto LAB_00102b4f;
      }
      pbVar1 = buffer + sVar4;
      pcVar2 = b + sVar4;
      sVar4 = sVar4 + 1;
    } while ((uint)*pbVar1 == (int)*pcVar2);
    poVar5 = std::operator<<((ostream *)&std::cerr,"string_equals: ");
    poVar5 = std::operator<<(poVar5,(char *)buffer);
    poVar5 = std::operator<<(poVar5," <> ");
    poVar5 = std::operator<<(poVar5,b);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"string_equals: ");
    poVar5 = std::operator<<(poVar5,(char *)buffer);
    poVar5 = std::operator<<(poVar5,"#");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," <> ");
    poVar5 = std::operator<<(poVar5,b);
    poVar5 = std::operator<<(poVar5,"#");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  std::operator<<(poVar5,"\n");
  bVar6 = false;
LAB_00102b4f:
  operator_delete__(buffer);
  return bVar6;
}

Assistant:

static bool string_equals(struct xml_string* a, const char* b) {
	size_t a_length = xml_string_length(a);
	size_t b_length = strlen(b);
	uint8_t* a_buffer = new uint8_t[((a_length + 1) * sizeof(uint8_t))];
	xml_string_copy(a, a_buffer, a_length);
	a_buffer[a_length] = 0;
	if (a_length != b_length) {
		std::cerr << "string_equals: " << a_buffer << "#" << a_length << " <> "
		  << b << "#" << b_length << "\n";
		delete[] a_buffer;
		return false;
	}
	size_t i = 0; for (; i < a_length; ++i) {
		if (a_buffer[i] != b[i]) {
			std::cerr << "string_equals: " << a_buffer << " <> " << b << "\n";
			delete[] a_buffer;
			return false;
		}
	}
	delete[] a_buffer;
	return true;
}